

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

int64_t r_code::Utils::GetGroupResilience
                  (double resilience,double origin_upr,double destination_upr)

{
  int64_t iVar1;
  double dVar2;
  double dVar3;
  
  iVar1 = 1;
  if (((origin_upr != 0.0) || (NAN(origin_upr))) && (origin_upr < destination_upr)) {
    dVar3 = (origin_upr / destination_upr) * resilience;
    dVar2 = 1.0;
    if (1.0 <= dVar3) {
      dVar2 = dVar3;
    }
    iVar1 = (int64_t)dVar2;
  }
  return iVar1;
}

Assistant:

int64_t Utils::GetGroupResilience(double resilience, double origin_upr, double destination_upr)
{
    if (origin_upr == 0) {
        return 1;
    }

    if (destination_upr <= origin_upr) {
        return 1;
    }

    double r = origin_upr / destination_upr;
    double res = resilience * r;

    if (res < 1) {
        return 1;
    }

    return res;
}